

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
google::protobuf::compiler::cpp::MessageVars_abi_cxx11_
          (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cpp *this,Descriptor *desc)

{
  string_view pc;
  string_view pc_00;
  string_view pc_01;
  string_view pc_02;
  string_view pc_03;
  string_view pc_04;
  string_view pc_05;
  string_view pc_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iVar1;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_718;
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6bc;
  key_equal local_6bb;
  hasher local_6ba;
  undefined1 local_6b9;
  AlphaNum local_6b8;
  size_t local_688;
  size_t sStack_680;
  AlphaNum local_678;
  undefined1 local_648 [80];
  size_t local_5f8;
  size_t sStack_5f0;
  AlphaNum local_5e8;
  undefined1 local_5b8 [80];
  size_t local_568;
  size_t sStack_560;
  AlphaNum local_558;
  undefined1 local_528 [80];
  size_t local_4d8;
  size_t sStack_4d0;
  AlphaNum local_4c8;
  undefined1 local_498 [80];
  size_t local_448;
  size_t sStack_440;
  AlphaNum local_438;
  undefined1 local_408 [80];
  size_t local_3b8;
  size_t sStack_3b0;
  AlphaNum local_3a8;
  undefined1 local_378 [80];
  size_t local_328;
  size_t sStack_320;
  AlphaNum local_318;
  undefined1 local_2e8 [96];
  size_t local_288;
  size_t sStack_280;
  AlphaNum local_270;
  undefined1 local_240 [40];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_38 [24];
  string_view prefix;
  Descriptor *desc_local;
  
  prefix._M_str = (char *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(local_38 + 0x10),"_impl_.");
  local_6b9 = 1;
  local_240._32_8_ = &local_218;
  local_288 = local_38._16_8_;
  sStack_280 = prefix._M_len;
  pc_06._M_str = (char *)prefix._M_len;
  pc_06._M_len = local_38._16_8_;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_270,pc_06);
  absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)(local_2e8 + 0x20),"_any_metadata_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_240,&local_270);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_218,(char (*) [13])"any_metadata",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
  local_328 = local_38._16_8_;
  sStack_320 = prefix._M_len;
  pc_05._M_str = (char *)prefix._M_len;
  pc_05._M_len = local_38._16_8_;
  local_240._32_8_ = &local_1e8;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_318,pc_05);
  absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)(local_378 + 0x20),"_cached_size_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_2e8,&local_318);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_1e8,(char (*) [12])0x61f869,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
  local_3b8 = local_38._16_8_;
  sStack_3b0 = prefix._M_len;
  pc_04._M_str = (char *)prefix._M_len;
  pc_04._M_len = local_38._16_8_;
  local_240._32_8_ = &local_1b8;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_3a8,pc_04);
  absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)(local_408 + 0x20),"_extensions_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_378,&local_3a8);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_1b8,(char (*) [11])0x69e539,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378);
  local_448 = local_38._16_8_;
  sStack_440 = prefix._M_len;
  pc_03._M_str = (char *)prefix._M_len;
  pc_03._M_len = local_38._16_8_;
  local_240._32_8_ = &local_188;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_438,pc_03);
  absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)(local_498 + 0x20),"_has_bits_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_408,&local_438);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_188,(char (*) [9])0x61eba0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408);
  local_4d8 = local_38._16_8_;
  sStack_4d0 = prefix._M_len;
  pc_02._M_str = (char *)prefix._M_len;
  pc_02._M_len = local_38._16_8_;
  local_240._32_8_ = &local_158;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_4c8,pc_02);
  absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)(local_528 + 0x20),"_inlined_string_donated_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_498,&local_4c8);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[29],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_158,(char (*) [29])"inlined_string_donated_array",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498);
  local_568 = local_38._16_8_;
  sStack_560 = prefix._M_len;
  pc_01._M_str = (char *)prefix._M_len;
  pc_01._M_len = local_38._16_8_;
  local_240._32_8_ = &local_128;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_558,pc_01);
  absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)(local_5b8 + 0x20),"_oneof_case_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_528,&local_558);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_128,(char (*) [11])"oneof_case",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528);
  local_240._32_8_ = &local_f8;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char_(&)[17],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_240._32_8_,(char (*) [8])"tracker",(char (*) [17])"Impl_::_tracker_");
  local_5f8 = local_38._16_8_;
  sStack_5f0 = prefix._M_len;
  pc_00._M_str = (char *)prefix._M_len;
  pc_00._M_len = local_38._16_8_;
  local_240._32_8_ = &local_c8;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_5e8,pc_00);
  absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)(local_648 + 0x20),"_weak_field_map_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_5b8,&local_5e8);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_c8,(char (*) [15])"weak_field_map",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b8);
  local_688 = local_38._16_8_;
  sStack_680 = prefix._M_len;
  pc._M_str = (char *)prefix._M_len;
  pc._M_len = local_38._16_8_;
  local_240._32_8_ = &local_98;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_678,pc);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_6b8,"_split_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_648,&local_678);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_98,(char (*) [6])0x5fffbf,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_648);
  local_240._32_8_ = &local_68;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[17],_const_char_(&)[17],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_240._32_8_,(char (*) [17])"cached_split_ptr",(char (*) [17])"cached_split_ptr"
            );
  local_6b9 = 0;
  local_38._0_8_ = &local_218;
  local_38._8_8_ = (char *)0xa;
  std::
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_6bc);
  iVar1._M_len = local_38._8_8_;
  iVar1._M_array = (iterator)local_38._0_8_;
  absl::lts_20240722::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::raw_hash_set(__return_storage_ptr__,iVar1,0,&local_6ba,&local_6bb,&local_6bc);
  std::
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_6bc);
  local_718 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_38;
  do {
    local_718 = local_718 + -1;
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_718);
  } while (local_718 != &local_218);
  std::__cxx11::string::~string((string *)local_648);
  std::__cxx11::string::~string((string *)local_5b8);
  std::__cxx11::string::~string((string *)local_528);
  std::__cxx11::string::~string((string *)local_498);
  std::__cxx11::string::~string((string *)local_408);
  std::__cxx11::string::~string((string *)local_378);
  std::__cxx11::string::~string((string *)local_2e8);
  std::__cxx11::string::~string((string *)local_240);
  return __return_storage_ptr__;
}

Assistant:

absl::flat_hash_map<absl::string_view, std::string> MessageVars(
    const Descriptor* desc) {
  absl::string_view prefix = "_impl_.";
  return {
      {"any_metadata", absl::StrCat(prefix, "_any_metadata_")},
      {"cached_size", absl::StrCat(prefix, "_cached_size_")},
      {"extensions", absl::StrCat(prefix, "_extensions_")},
      {"has_bits", absl::StrCat(prefix, "_has_bits_")},
      {"inlined_string_donated_array",
       absl::StrCat(prefix, "_inlined_string_donated_")},
      {"oneof_case", absl::StrCat(prefix, "_oneof_case_")},
      {"tracker", "Impl_::_tracker_"},
      {"weak_field_map", absl::StrCat(prefix, "_weak_field_map_")},
      {"split", absl::StrCat(prefix, "_split_")},
      {"cached_split_ptr", "cached_split_ptr"},
  };
}